

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiContext * ImGui::CreateContext(ImFontAtlas *shared_font_atlas)

{
  ImGuiContext *ctx_00;
  ImGuiContext *ctx;
  ImFontAtlas *in_stack_00000128;
  ImGuiContext *in_stack_00000130;
  undefined8 uVar1;
  
  uVar1 = 0x3db8;
  MemAlloc(0x3db8);
  ctx_00 = (ImGuiContext *)operator_new(uVar1);
  ImGuiContext::ImGuiContext(in_stack_00000130,in_stack_00000128);
  if (GImGui == (ImGuiContext *)0x0) {
    SetCurrentContext(ctx_00);
  }
  Initialize((ImGuiContext *)shared_font_atlas);
  return ctx_00;
}

Assistant:

ImGuiContext* ImGui::CreateContext(ImFontAtlas* shared_font_atlas)
{
    ImGuiContext* ctx = IM_NEW(ImGuiContext)(shared_font_atlas);
    if (GImGui == NULL)
        SetCurrentContext(ctx);
    Initialize(ctx);
    return ctx;
}